

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

string * __thiscall
GraphPropagator::all_to_dot_abi_cxx11_(string *__return_storage_ptr__,GraphPropagator *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  BoolView *pBVar5;
  undefined8 *puVar6;
  char cVar7;
  ulong uVar8;
  ulong *puVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  string __str;
  string __str_3;
  string __str_2;
  long *local_e8;
  long local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  string *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  GraphPropagator *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"graph {\n","");
  local_a8 = __return_storage_ptr__;
  if (0 < (int)(this->vs).sz) {
    uVar11 = 0;
    do {
      pBVar5 = (this->vs).data;
      cVar7 = sat.assigns.data[(uint)pBVar5[uVar11].v];
      if (cVar7 != 0) {
        if ((uint)pBVar5[uVar11].s * -2 + 1 == (int)cVar7) {
          uVar12 = 1;
          if (9 < uVar11) {
            uVar1 = 4;
            uVar8 = uVar11;
            do {
              uVar12 = uVar1;
              uVar13 = (uint)uVar8;
              if (uVar13 < 100) {
                uVar12 = uVar12 - 2;
                goto LAB_001c9aae;
              }
              if (uVar13 < 1000) {
                uVar12 = uVar12 - 1;
                goto LAB_001c9aae;
              }
              if (uVar13 < 10000) goto LAB_001c9aae;
              uVar8 = (uVar8 & 0xffffffff) / 10000;
              uVar1 = uVar12 + 4;
            } while (99999 < uVar13);
            uVar12 = uVar12 + 1;
          }
LAB_001c9aae:
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar12);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,uVar12,(uint)uVar11);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1d8ae4);
          __return_storage_ptr__ = local_a8;
          local_c8 = &local_b8;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_b8 = *puVar9;
            lStack_b0 = plVar4[3];
          }
          else {
            local_b8 = *puVar9;
            local_c8 = (ulong *)*plVar4;
          }
          local_c0 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_e8 = &local_d8;
          plVar10 = plVar4 + 2;
          if ((long *)*plVar4 == plVar10) {
            local_d8 = *plVar10;
            lStack_d0 = plVar4[3];
          }
          else {
            local_d8 = *plVar10;
            local_e8 = (long *)*plVar4;
          }
          *plVar4 = (long)plVar10;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e8);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          pBVar5 = (this->vs).data;
          cVar7 = sat.assigns.data[(uint)pBVar5[uVar11].v];
          if (cVar7 == '\0') goto LAB_001c9d99;
        }
        if ((uint)pBVar5[uVar11].s * 2 + -1 == (int)cVar7) {
          uVar12 = 1;
          if (9 < uVar11) {
            uVar1 = 4;
            uVar8 = uVar11;
            do {
              uVar12 = uVar1;
              uVar13 = (uint)uVar8;
              if (uVar13 < 100) {
                uVar12 = uVar12 - 2;
                goto LAB_001c9c6a;
              }
              if (uVar13 < 1000) {
                uVar12 = uVar12 - 1;
                goto LAB_001c9c6a;
              }
              if (uVar13 < 10000) goto LAB_001c9c6a;
              uVar8 = (uVar8 & 0xffffffff) / 10000;
              uVar1 = uVar12 + 4;
            } while (99999 < uVar13);
            uVar12 = uVar12 + 1;
          }
LAB_001c9c6a:
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar12);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,uVar12,(uint)uVar11);
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1d8ae4);
          __return_storage_ptr__ = local_a8;
          local_c8 = &local_b8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_b8 = *puVar9;
            lStack_b0 = puVar6[3];
          }
          else {
            local_b8 = *puVar9;
            local_c8 = (ulong *)*puVar6;
          }
          local_c0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
          local_e8 = &local_d8;
          plVar4 = puVar6 + 2;
          if ((long *)*puVar6 == plVar4) {
            local_d8 = *plVar4;
            lStack_d0 = puVar6[3];
          }
          else {
            local_d8 = *plVar4;
            local_e8 = (long *)*puVar6;
          }
          *puVar6 = plVar4;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e8);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
        }
      }
LAB_001c9d99:
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)(int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    uVar11 = 0;
    local_78 = this;
    do {
      uVar12 = **(uint **)&(local_78->endnodes).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
      uVar1 = -uVar12;
      if (0 < (int)uVar12) {
        uVar1 = uVar12;
      }
      uVar13 = 1;
      if (9 < uVar1) {
        uVar8 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar13 = uVar2;
          uVar3 = (uint)uVar8;
          if (uVar3 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_001c9e27;
          }
          if (uVar3 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_001c9e27;
          }
          if (uVar3 < 10000) goto LAB_001c9e27;
          uVar8 = uVar8 / 10000;
          uVar2 = uVar13 + 4;
        } while (99999 < uVar3);
        uVar13 = uVar13 + 1;
      }
LAB_001c9e27:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar13 - (char)((int)uVar12 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar12 >> 0x1f),uVar13,uVar1);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1d8ae4);
      local_a0 = &local_90;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_90 = *plVar10;
        lStack_88 = plVar4[3];
      }
      else {
        local_90 = *plVar10;
        local_a0 = (long *)*plVar4;
      }
      local_98 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
      puVar9 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar9) {
        local_b8 = *puVar9;
        lStack_b0 = puVar6[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar9;
        local_c8 = (ulong *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      uVar12 = *(uint *)(*(long *)&(local_78->endnodes).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + 4);
      uVar1 = -uVar12;
      if (0 < (int)uVar12) {
        uVar1 = uVar12;
      }
      uVar13 = 1;
      if (9 < uVar1) {
        uVar8 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar13 = uVar2;
          uVar3 = (uint)uVar8;
          if (uVar3 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_001c9f8f;
          }
          if (uVar3 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_001c9f8f;
          }
          if (uVar3 < 10000) goto LAB_001c9f8f;
          uVar8 = uVar8 / 10000;
          uVar2 = uVar13 + 4;
        } while (99999 < uVar3);
        uVar13 = uVar13 + 1;
      }
LAB_001c9f8f:
      local_70 = local_60;
      std::__cxx11::string::_M_construct
                ((ulong)&local_70,(char)uVar13 - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_70),uVar13,uVar1);
      __return_storage_ptr__ = local_a8;
      uVar8 = 0xf;
      if (local_c8 != &local_b8) {
        uVar8 = local_b8;
      }
      if (uVar8 < (ulong)(local_68 + local_c0)) {
        uVar8 = 0xf;
        if (local_70 != local_60) {
          uVar8 = local_60[0];
        }
        if (uVar8 < (ulong)(local_68 + local_c0)) goto LAB_001ca02d;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_001ca02d:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_70);
      }
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_d8 = *plVar4;
        lStack_d0 = puVar6[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar4;
        local_e8 = (long *)*puVar6;
      }
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)plVar4 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pBVar5 = (local_78->es).data;
      cVar7 = sat.assigns.data[(uint)pBVar5[uVar11].v];
      if ((cVar7 != '\0') &&
         ((uVar12 = (uint)pBVar5[uVar11].s, uVar12 * -2 + 1 == (int)cVar7 ||
          (uVar12 * 2 + -1 == (int)cVar7)))) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar12 = 1;
      if (9 < uVar11) {
        uVar1 = 4;
        uVar8 = uVar11;
        do {
          uVar12 = uVar1;
          uVar13 = (uint)uVar8;
          if (uVar13 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_001ca196;
          }
          if (uVar13 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_001ca196;
          }
          if (uVar13 < 10000) goto LAB_001ca196;
          uVar8 = (uVar8 & 0xffffffff) / 10000;
          uVar1 = uVar12 + 4;
        } while (99999 < uVar13);
        uVar12 = uVar12 + 1;
      }
LAB_001ca196:
      local_a0 = &local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar12);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,uVar12,(uint)uVar11);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1dcf8f);
      puVar9 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar9) {
        local_b8 = *puVar9;
        lStack_b0 = puVar6[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar9;
        local_c8 = (ulong *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_d8 = *plVar4;
        lStack_d0 = puVar6[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar4;
        local_e8 = (long *)*puVar6;
      }
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)(int)(local_78->es).sz);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphPropagator::all_to_dot() {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
		if (getNodeVar(n).isFixed() && getNodeVar(n).isFalse()) {
			res += " " + std::to_string(n) + " [color = yellow];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
			res += " [color = red] ";
		} else if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			res += " [color = yellow] ";
		}
		res += "[label = \"" + std::to_string(e) + "\"]";
		res += ";\n";
	}
	res += "}";

	return res;
}